

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalaha.h
# Opt level: O0

void __thiscall KalahaState<(short)6>::do_move(KalahaState<(short)6> *this,Move move)

{
  short in_SI;
  byte *in_RDI;
  short m_1;
  int opposite;
  int m;
  short *lower_store;
  short seeds;
  short *lower_bins;
  short *upper_bins;
  int in_stack_000001f4;
  char *in_stack_000001f8;
  char *in_stack_00000200;
  byte *local_60;
  byte *local_58;
  byte *local_50;
  short local_3a;
  int local_34;
  short local_22;
  
  if ((*in_RDI & 1) == 0) {
    if ((in_SI < 0) || (5 < in_SI)) {
      MCTS::assertion_failed(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
    }
    if (*(int *)(in_RDI + 4) == 1) {
      local_50 = in_RDI + 0x14;
    }
    else {
      local_50 = in_RDI + 8;
    }
    if (*(int *)(in_RDI + 4) == 1) {
      local_58 = in_RDI + 8;
    }
    else {
      local_58 = in_RDI + 0x14;
    }
    if (*(short *)(local_58 + (long)in_SI * 2) < 1) {
      MCTS::assertion_failed(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
    }
    local_22 = *(short *)(local_58 + (long)in_SI * 2);
    (local_58 + (long)in_SI * 2)[0] = 0;
    (local_58 + (long)in_SI * 2)[1] = 0;
    if (*(int *)(in_RDI + 4) == 1) {
      local_60 = in_RDI + 0x20;
    }
    else {
      local_60 = in_RDI + 0x22;
    }
    while (0 < local_22) {
      local_34 = (int)in_SI;
      while (local_34 = local_34 + 1, local_34 < 6 && 0 < local_22) {
        *(short *)(local_58 + (long)local_34 * 2) = *(short *)(local_58 + (long)local_34 * 2) + 1;
        local_22 = local_22 + -1;
        if ((local_22 == 0) && (*(short *)(local_58 + (long)local_34 * 2) == 1)) {
          *(short *)local_60 =
               *(short *)local_60 +
               *(short *)(local_58 + (long)local_34 * 2) +
               *(short *)(local_50 + (long)(5 - local_34) * 2);
          (local_58 + (long)local_34 * 2)[0] = 0;
          (local_58 + (long)local_34 * 2)[1] = 0;
          (local_50 + (long)(5 - local_34) * 2)[0] = 0;
          (local_50 + (long)(5 - local_34) * 2)[1] = 0;
        }
      }
      if (local_22 == 0) break;
      *(short *)local_60 = *(short *)local_60 + 1;
      local_22 = local_22 + -1;
      if (local_22 == 0) {
        *in_RDI = 1;
        break;
      }
      for (local_3a = 0; local_3a < 6 && 0 < local_22; local_3a = local_3a + 1) {
        *(short *)(local_50 + (long)local_3a * 2) = *(short *)(local_50 + (long)local_3a * 2) + 1;
        local_22 = local_22 + -1;
      }
    }
    *(int *)(in_RDI + 4) = 3 - *(int *)(in_RDI + 4);
  }
  else {
    if (in_SI != -1) {
      MCTS::assertion_failed(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
    }
    *in_RDI = 0;
    *(int *)(in_RDI + 4) = 3 - *(int *)(in_RDI + 4);
  }
  return;
}

Assistant:

void do_move(Move move)
	{
		if (player_must_pass) {
			attest(move == pass_move);
			player_must_pass = false;
			player_to_move = 3 - player_to_move;
			return;
		}

		attest(0 <= move && move < num_bins);
		short* upper_bins = player_to_move == 1 ? player2_bins : player1_bins;
		short* lower_bins = player_to_move == 1 ? player1_bins : player2_bins;
		attest(lower_bins[move] > 0);
		auto seeds = lower_bins[move];
		lower_bins[move] = 0;

		short* lower_store = player_to_move == 1 ? &player1_store : &player2_store;

		while (seeds > 0) {
			// Move along lower bins.
			for (auto m = move + 1; m < num_bins && seeds > 0; ++m) {
				lower_bins[m] += 1;
				seeds -= 1;

				if (seeds == 0) {
					// Land in an empty square with opposite markers?
					auto opposite = num_bins - 1 - m;
					if (lower_bins[m] == 1 /* && upper_bins[opposite] > 0 */) { // Allow null capture?
						// Capture everything
						*lower_store += lower_bins[m] + upper_bins[opposite];
						lower_bins[m] = 0;
						upper_bins[opposite] = 0;
					}
				}
			}

			if (seeds == 0) {
				break;
			}

			// Put a seed in the store.
			*lower_store += 1;
			seeds -= 1;
			if (seeds == 0) {
				// Last seed in store; gets an extra turn.
				player_must_pass = true;
				break;
			}

			// Move along upper bins.
			for (short m = 0; m < num_bins && seeds > 0; ++m) {
				upper_bins[m] += 1;
				seeds -= 1;
			}
		}

		player_to_move = 3 - player_to_move;
	}